

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O1

ssize_t rpm_filter_read(archive_read_filter *self,void **buff)

{
  uint uVar1;
  long *plVar2;
  char *__src;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  ulong request;
  bool bVar8;
  ssize_t avail_in;
  ulong local_50;
  long *local_48;
  void **local_40;
  long *local_38;
  
  plVar2 = (long *)self->data;
  request = 0;
  *buff = (void *)0x0;
  local_50 = 0;
  local_48 = plVar2 + 1;
  plVar7 = plVar2 + 3;
  pcVar3 = (char *)0x0;
  local_40 = buff;
  local_38 = plVar7;
  do {
    __src = pcVar3;
    if ((pcVar3 == (char *)0x0) &&
       (__src = (char *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_50),
       plVar7 = local_38, __src == (char *)0x0)) {
      if ((long)local_50 < 0) {
        return -0x1e;
      }
      uVar5 = 0;
      bVar8 = false;
      goto LAB_003f21ef;
    }
    switch((int)plVar2[5]) {
    case 0:
      if ((long)(local_50 + *plVar2) < 0x60) {
        request = request + local_50;
      }
      else {
        lVar6 = 0x60 - *plVar2;
        request = request + lVar6;
        __src = __src + lVar6;
        *(undefined4 *)(plVar2 + 5) = 1;
        *local_48 = 0;
        local_48[1] = 0;
        *(undefined4 *)((long)plVar2 + 0x2c) = 1;
      }
    default:
switchD_003f1fd4_default:
      uVar5 = 0;
      pcVar3 = __src;
      break;
    case 1:
      uVar4 = 0x10 - plVar2[1];
      uVar5 = local_50 - request;
      if (uVar4 < local_50 - request) {
        uVar5 = uVar4;
      }
      memcpy((void *)(plVar2[1] + (long)plVar7),__src,uVar5);
      pcVar3 = __src + uVar5;
      request = request + uVar5;
      lVar6 = plVar2[1];
      plVar2[1] = uVar5 + lVar6;
      if (uVar5 + lVar6 == 0x10) {
        if (((((char)*plVar7 != -0x72) || (*(char *)((long)plVar2 + 0x19) != -0x53)) ||
            (*(char *)((long)plVar2 + 0x1a) != -0x18)) || (*(char *)((long)plVar2 + 0x1b) != '\x01')
           ) {
          if (*(int *)((long)plVar2 + 0x2c) != 0) {
            archive_set_error(&self->archive->archive,0x54,"Unrecoginized rpm header");
            return -0x1e;
          }
          *(undefined4 *)(plVar2 + 5) = 4;
          *local_40 = plVar7;
          uVar5 = 0x10;
          break;
        }
        uVar1 = *(uint *)((long)plVar2 + 0x24);
        plVar2[2] = (ulong)(((uint)*(byte *)((long)plVar2 + 0x23) << 4 |
                             (uint)*(byte *)((long)plVar2 + 0x22) << 0xc |
                             (uint)*(byte *)((long)plVar2 + 0x21) << 0x14 |
                            (uint)*(byte *)(plVar2 + 4) << 0x1c) +
                            (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                            uVar1 << 0x18) + 0x10);
        plVar2[5] = 2;
      }
      uVar5 = 0;
      break;
    case 2:
      uVar4 = plVar2[2] - plVar2[1];
      uVar5 = local_50 - request;
      if (uVar4 < local_50 - request) {
        uVar5 = uVar4;
      }
      __src = __src + uVar5;
      request = request + uVar5;
      lVar6 = uVar5 + plVar2[1];
      plVar2[1] = lVar6;
      if (lVar6 == plVar2[2]) {
        *(undefined4 *)(plVar2 + 5) = 3;
      }
      goto switchD_003f1fd4_default;
    case 3:
      if (local_50 < request || local_50 - request == 0) goto switchD_003f1fd4_default;
      pcVar3 = __src + (local_50 - request);
      do {
        if (*__src != '\0') {
          *(undefined4 *)(plVar2 + 5) = 1;
          *local_48 = 0;
          local_48[1] = 0;
          goto switchD_003f1fd4_default;
        }
        __src = __src + 1;
        request = request + 1;
      } while (local_50 != request);
      uVar5 = 0;
      request = local_50;
      break;
    case 4:
      *local_40 = __src;
      uVar5 = local_50;
      pcVar3 = __src;
      request = local_50;
    }
    if (request == local_50) {
      *plVar2 = *plVar2 + request;
      __archive_read_filter_consume(self->upstream,request);
      request = 0;
      pcVar3 = (char *)0x0;
      plVar7 = local_38;
    }
  } while ((uVar5 == 0) && (0 < (long)local_50));
  bVar8 = pcVar3 != (char *)0x0;
LAB_003f21ef:
  if ((request != 0) && (bVar8)) {
    *plVar2 = *plVar2 + request;
    __archive_read_filter_consume(self->upstream,request);
  }
  return uVar5;
}

Assistant:

static ssize_t
rpm_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct rpm *rpm;
	const unsigned char *b;
	ssize_t avail_in, total;
	size_t used, n;
	uint32_t section;
	uint32_t bytes;

	rpm = (struct rpm *)self->data;
	*buff = NULL;
	total = avail_in = 0;
	b = NULL;
	used = 0;
	do {
		if (b == NULL) {
			b = __archive_read_filter_ahead(self->upstream, 1,
			    &avail_in);
			if (b == NULL) {
				if (avail_in < 0)
					return (ARCHIVE_FATAL);
				else
					break;
			}
		}

		switch (rpm->state) {
		case ST_LEAD:
			if (rpm->total_in + avail_in < RPM_LEAD_SIZE)
				used += avail_in;
			else {
				n = (size_t)(RPM_LEAD_SIZE - rpm->total_in);
				used += n;
				b += n;
				rpm->state = ST_HEADER;
				rpm->hpos = 0;
				rpm->hlen = 0;
				rpm->first_header = 1;
			}
			break;
		case ST_HEADER:
			n = 16 - rpm->hpos;
			if (n > avail_in - used)
				n = avail_in - used;
			memcpy(rpm->header+rpm->hpos, b, n);
			b += n;
			used += n;
			rpm->hpos += n;

			if (rpm->hpos == 16) {
				if (rpm->header[0] != 0x8e ||
				    rpm->header[1] != 0xad ||
				    rpm->header[2] != 0xe8 ||
				    rpm->header[3] != 0x01) {
					if (rpm->first_header) {
						archive_set_error(
						    &self->archive->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Unrecoginized rpm header");
						return (ARCHIVE_FATAL);
					}
					rpm->state = ST_ARCHIVE;
					*buff = rpm->header;
					total = rpm->hpos;
					break;
				}
				/* Calculate 'Header' length. */
				section = archive_be32dec(rpm->header+8);
				bytes = archive_be32dec(rpm->header+12);
				rpm->hlen = 16 + section * 16 + bytes;
				rpm->state = ST_HEADER_DATA;
				rpm->first_header = 0;
			}
			break;
		case ST_HEADER_DATA:
			n = rpm->hlen - rpm->hpos;
			if (n > avail_in - used)
				n = avail_in - used;
			b += n;
			used += n;
			rpm->hpos += n;
			if (rpm->hpos == rpm->hlen)
				rpm->state = ST_PADDING;
			break;
		case ST_PADDING:
			while (used < (size_t)avail_in) {
				if (*b != 0) {
					/* Read next header. */
					rpm->state = ST_HEADER;
					rpm->hpos = 0;
					rpm->hlen = 0;
					break;
				}
				b++;
				used++;
			}
			break;
		case ST_ARCHIVE:
			*buff = b;
			total = avail_in;
			used = avail_in;
			break;
		}
		if (used == (size_t)avail_in) {
			rpm->total_in += used;
			__archive_read_filter_consume(self->upstream, used);
			b = NULL;
			used = 0;
		}
	} while (total == 0 && avail_in > 0);

	if (used > 0 && b != NULL) {
		rpm->total_in += used;
		__archive_read_filter_consume(self->upstream, used);
	}
	return (total);
}